

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_resampler_init(ma_resampler_config *pConfig,ma_resampler *pResampler)

{
  ma_uint32 *pmVar1;
  ma_lpf *__s;
  ma_lpf1 *__s_00;
  double dVar2;
  ma_format mVar3;
  ma_uint32 mVar4;
  uint uVar5;
  ma_format mVar6;
  ma_uint32 mVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  anon_struct_4_1_aa2af3df_for_speex aVar12;
  undefined4 uVar13;
  ma_resample_algorithm mVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ma_uint32 mVar17;
  ma_uint32 mVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ma_lpf2 *__s_01;
  bool bVar27;
  float fVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  if (pResampler == (ma_resampler *)0x0) {
    return -2;
  }
  memset(pResampler,0,0x670);
  if (pConfig == (ma_resampler_config *)0x0) {
    return -2;
  }
  if ((pConfig->format != ma_format_f32) && (pConfig->format != ma_format_s16)) {
    return -2;
  }
  mVar3 = pConfig->format;
  mVar7 = pConfig->channels;
  mVar17 = pConfig->sampleRateIn;
  mVar18 = pConfig->sampleRateOut;
  mVar14 = pConfig->algorithm;
  uVar15 = *(undefined4 *)&pConfig->field_0x14;
  mVar4 = (pConfig->linear).lpfOrder;
  uVar16 = *(undefined4 *)&(pConfig->linear).field_0x4;
  aVar12.quality = (pConfig->speex).quality;
  uVar13 = *(undefined4 *)&pConfig->field_0x2c;
  (pResampler->config).linear.lpfNyquistFactor = (pConfig->linear).lpfNyquistFactor;
  (pResampler->config).speex = (anon_struct_4_1_aa2af3df_for_speex)aVar12.quality;
  *(undefined4 *)&(pResampler->config).field_0x2c = uVar13;
  (pResampler->config).algorithm = mVar14;
  *(undefined4 *)&(pResampler->config).field_0x14 = uVar15;
  (pResampler->config).linear.lpfOrder = mVar4;
  *(undefined4 *)&(pResampler->config).linear.field_0x4 = uVar16;
  (pResampler->config).format = mVar3;
  (pResampler->config).channels = mVar7;
  (pResampler->config).sampleRateIn = mVar17;
  (pResampler->config).sampleRateOut = mVar18;
  if (pConfig->algorithm == ma_resample_algorithm_speex) {
    return -0x67;
  }
  if (pConfig->algorithm != ma_resample_algorithm_linear) {
    return -2;
  }
  mVar3 = pConfig->format;
  mVar4 = pConfig->channels;
  uVar20 = pConfig->sampleRateIn;
  uVar25 = pConfig->sampleRateOut;
  uVar5 = (pConfig->linear).lpfOrder;
  dVar2 = (pConfig->linear).lpfNyquistFactor;
  memset(&pResampler->state,0,0x640);
  (pResampler->state).linear.config.format = mVar3;
  (pResampler->state).linear.config.channels = mVar4;
  (pResampler->state).linear.config.sampleRateIn = uVar20;
  (pResampler->state).linear.config.sampleRateOut = uVar25;
  (pResampler->state).linear.config.lpfOrder = uVar5;
  *(undefined4 *)&(pResampler->state).linear.config.field_0x14 = 0;
  *(double *)((long)&pResampler->state + 0x18) = dVar2;
  iVar21 = -2;
  uVar19 = uVar20;
  uVar23 = uVar25;
  if (uVar25 == 0 || uVar20 == 0) goto LAB_00110cd4;
  do {
    uVar22 = uVar23;
    uVar23 = uVar19 % uVar22;
    uVar19 = uVar22;
  } while (uVar23 != 0);
  uVar24 = (ulong)uVar20 / (ulong)uVar22;
  uVar20 = (uint)uVar24;
  (pResampler->state).linear.config.sampleRateIn = uVar20;
  uVar8 = (ulong)uVar25 / (ulong)uVar22;
  uVar25 = (uint)uVar8;
  (pResampler->state).linear.config.sampleRateOut = uVar25;
  if (uVar5 != 0) {
    if (uVar5 < 9) {
      uVar9 = uVar8;
      if (uVar25 < uVar20) {
        uVar9 = uVar24;
      }
      if (uVar20 < uVar25) {
        uVar8 = uVar24;
      }
      __s = &(pResampler->state).linear.lpf;
      memset(__s,0,0x50c);
      if ((((mVar3 == ma_format_f32) || (iVar21 = -2, mVar3 == ma_format_s16)) &&
          (mVar6 = __s->format, iVar21 = -3, mVar6 == ma_format_unknown || mVar6 == mVar3)) &&
         (mVar7 = (pResampler->state).linear.lpf.channels, mVar7 == mVar4 || mVar7 == 0)) {
        dVar2 = dVar2 * (double)uVar8 * 0.5;
        uVar25 = uVar5 & 1;
        __s_00 = (pResampler->state).linear.lpf.lpf1;
        uVar20 = 0;
        do {
          if (uVar25 <= uVar20) {
            if (uVar5 == 1) goto LAB_00110c85;
            __s_01 = (pResampler->state).linear.lpf.lpf2;
            dVar2 = (dVar2 * 6.283185307179586) / (double)uVar9;
            iVar26 = 1;
            uVar24 = 0;
            goto LAB_00110d54;
          }
          bVar27 = false;
          memset(__s_00,0,0x8c);
          if ((mVar3 == ma_format_f32) || (mVar3 == ma_format_s16)) {
            mVar6 = __s_00->format;
            iVar21 = -3;
            if ((mVar6 == ma_format_unknown || mVar6 == mVar3) &&
               (mVar7 = (pResampler->state).linear.lpf.lpf1[0].channels,
               mVar7 == mVar4 || mVar7 == 0)) {
              (pResampler->state).linear.lpf.lpf1[0].format = mVar3;
              (pResampler->state).linear.lpf.lpf1[0].channels = mVar4;
              dVar29 = exp((dVar2 * -6.283185307179586) / (double)uVar9);
              if (mVar3 == ma_format_f32) {
                *(float *)((long)&pResampler->state + 0x148) = (float)dVar29;
              }
              else {
                (pResampler->state).linear.lpf.lpf1[0].a.s32 = (int)(dVar29 * 16384.0);
              }
              iVar21 = 0;
              bVar27 = true;
            }
            else {
              bVar27 = false;
            }
          }
          else {
            iVar21 = -2;
          }
          uVar20 = 1;
        } while (bVar27);
      }
      goto LAB_00110cac;
    }
    iVar21 = -2;
    bVar27 = false;
    goto LAB_00110cb1;
  }
  goto LAB_00110cb5;
  while( true ) {
    uVar24 = uVar24 + 1;
    iVar26 = iVar26 + 2;
    __s_01 = __s_01 + 1;
    if (uVar5 >> 1 == uVar24) break;
LAB_00110d54:
    iVar21 = (int)uVar24 + 1;
    if (uVar25 == 0) {
      iVar21 = iVar26;
    }
    dVar29 = sin(1.5707963705062866 -
                 (double)iVar21 * (3.141592653589793 / (double)(uVar5 << ((byte)uVar25 ^ 1))));
    dVar30 = 1.0 / (dVar29 + dVar29);
    bVar27 = false;
    memset(__s_01,0,0x11c);
    dVar29 = sin(dVar2);
    dVar10 = sin(1.5707963705062866 - dVar2);
    dVar29 = dVar29 / (double)(-(ulong)(dVar30 == 0.0) & 0x3ff6a09edbf8b9bb |
                              ~-(ulong)(dVar30 == 0.0) & (ulong)(dVar30 + dVar30));
    dVar30 = dVar29 + 1.0;
    memset(__s_01,0,0x11c);
    iVar21 = -2;
    if ((dVar30 != 0.0) || (NAN(dVar30))) {
      if (((mVar3 == ma_format_f32) || (iVar21 = -2, mVar3 == ma_format_s16)) &&
         ((mVar6 = (__s_01->bq).format, iVar21 = -3, mVar6 == ma_format_unknown || mVar6 == mVar3 &&
          (mVar7 = (__s_01->bq).channels, mVar7 == mVar4 || mVar7 == 0)))) {
        dVar29 = 1.0 - dVar29;
        (__s_01->bq).format = mVar3;
        (__s_01->bq).channels = mVar4;
        dVar31 = ((1.0 - dVar10) * 0.5) / dVar30;
        dVar11 = (1.0 - dVar10) / dVar30;
        if (mVar3 == ma_format_f32) {
          fVar28 = (float)dVar31;
          (__s_01->bq).b0.f32 = fVar28;
          (__s_01->bq).b1.f32 = (float)dVar11;
          (__s_01->bq).b2.f32 = fVar28;
          (__s_01->bq).a1.f32 = (float)((dVar10 * -2.0) / dVar30);
          (__s_01->bq).a2.f32 = (float)(dVar29 / dVar30);
        }
        else {
          iVar21 = (int)(dVar31 * 16384.0);
          (__s_01->bq).b0.s32 = iVar21;
          (__s_01->bq).b1.s32 = (int)(dVar11 * 16384.0);
          (__s_01->bq).b2.s32 = iVar21;
          (__s_01->bq).a1.s32 = (int)(((dVar10 * -2.0) / dVar30) * 16384.0);
          (__s_01->bq).a2.s32 = (int)((dVar29 / dVar30) * 16384.0);
        }
        iVar21 = 0;
        bVar27 = true;
      }
      else {
        bVar27 = false;
      }
    }
    if (!bVar27) goto LAB_00110cac;
  }
LAB_00110c85:
  (pResampler->state).linear.lpf.lpf1Count = uVar25;
  (pResampler->state).linear.lpf.lpf2Count = uVar5 >> 1;
  (pResampler->state).linear.lpf.format = mVar3;
  (pResampler->state).linear.lpf.channels = mVar4;
  iVar21 = 0;
LAB_00110cac:
  bVar27 = iVar21 == 0;
LAB_00110cb1:
  if (!bVar27) goto LAB_00110cd4;
LAB_00110cb5:
  uVar20 = (pResampler->state).linear.config.sampleRateIn;
  uVar25 = (pResampler->state).linear.config.sampleRateOut;
  (pResampler->state).linear.inAdvanceInt = uVar20 / uVar25;
  (pResampler->state).linear.inAdvanceFrac = uVar20 % uVar25;
  uVar20 = (pResampler->state).linear.inTimeFrac;
  pmVar1 = &(pResampler->state).linear.inTimeInt;
  *pmVar1 = *pmVar1 + uVar20 / uVar25;
  (pResampler->state).linear.inTimeFrac = uVar20 % uVar25;
  iVar21 = 0;
LAB_00110cd4:
  if (iVar21 == 0) {
    *(undefined8 *)((long)&pResampler->state + 0x28) = 1;
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

MA_API ma_result ma_resampler_init(const ma_resampler_config* pConfig, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    pResampler->config = *pConfig;

    switch (pConfig->algorithm)
    {
        case ma_resample_algorithm_linear:
        {
            ma_linear_resampler_config linearConfig;
            linearConfig = ma_linear_resampler_config_init(pConfig->format, pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut);
            linearConfig.lpfOrder         = pConfig->linear.lpfOrder;
            linearConfig.lpfNyquistFactor = pConfig->linear.lpfNyquistFactor;

            result = ma_linear_resampler_init(&linearConfig, &pResampler->state.linear);
            if (result != MA_SUCCESS) {
                return result;
            }
        } break;

        case ma_resample_algorithm_speex:
        {
        #if defined(MA_HAS_SPEEX_RESAMPLER)
            int speexErr;
            pResampler->state.speex.pSpeexResamplerState = speex_resampler_init(pConfig->channels, pConfig->sampleRateIn, pConfig->sampleRateOut, pConfig->speex.quality, &speexErr);
            if (pResampler->state.speex.pSpeexResamplerState == NULL) {
                return ma_result_from_speex_err(speexErr);
            }
        #else
            /* Speex resampler not available. */
            return MA_NO_BACKEND;
        #endif
        } break;

        default: return MA_INVALID_ARGS;
    }

    return MA_SUCCESS;
}